

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O1

void __thiscall echo_server::connection::try_write(connection *this)

{
  ulong uVar1;
  timer *t;
  size_t sVar2;
  
  uVar1 = this->start_offset;
  sVar2 = this->end_offset - uVar1;
  if (uVar1 <= this->end_offset && sVar2 != 0) {
    sVar2 = client_socket::write_some(&this->socket,this->buf + uVar1,sVar2);
    if (sVar2 != 0) {
      t = sysapi::epoll::get_timer(this->parent->ep);
      timer_element::restart(&this->timer,t,(duration)0x37e11d600);
      sVar2 = sVar2 + this->start_offset;
      this->start_offset = sVar2;
      if (sVar2 == this->end_offset) {
        this->start_offset = 0;
        this->end_offset = 0;
      }
    }
    return;
  }
  __assert_fail("start_offset < end_offset",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/echo_server.cpp"
                ,0x1f,"void echo_server::connection::try_write()");
}

Assistant:

void echo_server::connection::try_write()
{
    assert(start_offset < end_offset);
    assert(end_offset != 0);

    size_t written = socket.write_some(buf + start_offset, end_offset - start_offset);
    if (written == 0)
        return;

    timer.restart(parent->ep.get_timer(), timeout);
    start_offset += written;
    if (start_offset == end_offset)
    {
        start_offset = 0;
        end_offset = 0;
    }
}